

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ByteData * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionContext *this,OutPoint *outpoint,
          Script *redeem_script,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  SigHashType local_3c;
  
  txin_index = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                 _vptr_AbstractTransaction[0xf])(this,outpoint);
  core::Script::GetData((ByteData *)&local_70,redeem_script);
  core::SigHashType::SigHashType(&local_3c,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            ((ByteData256 *)&local_58,&this->super_ConfidentialTransaction,txin_index,
             (ByteData *)&local_70,&local_3c,value,version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  core::ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
             (ByteData256 *)&local_58);
  core::ByteData::ByteData
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Script& redeem_script,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  // TODO(k-matsuzawa): For now, when using OP_CODESEPARATOR, divide it on the user side and ask them to specify only the applicable part.  // NOLINT
  ByteData256 sighash = GetElementsSignatureHash(
      GetTxInIndex(outpoint), redeem_script.GetData(), sighash_type, value,
      version);
  return ByteData(sighash.GetBytes());
}